

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void dtranspose(double *sig,int rows,int cols,double *col)

{
  uint uVar1;
  ulong uVar2;
  double *pdVar3;
  int iVar4;
  int max;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  double *pdVar10;
  double *pdVar11;
  
  uVar5 = (ulong)(uint)cols;
  if (rows < cols) {
    uVar5 = (ulong)(uint)rows;
  }
  lVar6 = (long)rows;
  lVar8 = (long)cols;
  lVar9 = (long)(1 - rows);
  pdVar10 = col + lVar6 * lVar9;
  pdVar11 = sig + -(lVar8 * lVar9);
  uVar1 = 0;
  for (; lVar9 < lVar8; lVar9 = lVar9 + 1) {
    if (lVar9 < 1) {
      uVar2 = (ulong)(uVar1 + 1);
      if ((int)uVar5 <= (int)(uVar1 + 1)) {
        uVar2 = uVar5;
      }
      iVar4 = 0;
      uVar1 = (uint)uVar2;
      uVar7 = 0;
      pdVar3 = pdVar11;
      if (0 < (int)uVar1) {
        uVar7 = uVar2;
      }
      while (uVar7 != 0) {
        col[iVar4 - lVar9] = *pdVar3;
        iVar4 = iVar4 + rows + 1;
        uVar7 = uVar7 - 1;
        pdVar3 = pdVar3 + lVar8 + 1;
      }
    }
    else {
      uVar2 = (ulong)(uVar1 - 1);
      if ((int)uVar5 < (int)uVar1) {
        uVar2 = uVar5;
      }
      if ((rows - cols) + (int)lVar9 < 1) {
        uVar2 = (ulong)uVar1;
      }
      iVar4 = 0;
      uVar1 = (uint)uVar2;
      pdVar3 = pdVar10;
      uVar7 = 0;
      if (0 < (int)uVar1) {
        uVar7 = uVar2;
      }
      while (uVar7 != 0) {
        *pdVar3 = sig[lVar9 + iVar4];
        iVar4 = iVar4 + cols + 1;
        pdVar3 = pdVar3 + lVar6 + 1;
        uVar7 = uVar7 - 1;
      }
    }
    pdVar10 = pdVar10 + lVar6;
    pdVar11 = pdVar11 + -lVar8;
  }
  return;
}

Assistant:

void dtranspose(double *sig, int rows, int cols,double *col) {
    int max,ud,i,k;
    if (rows >= cols) {
    	max = cols;
    } else {
    	max = rows;
    }
    ud = 0;
	for (i= -rows + 1; i < cols; i++) {
		if (i <= 0) {
			ud++;
			if (ud >= max)
				ud = max;
			for (k = 0; k < ud; k++) {
				col[k*rows+k-i] = sig[(k-i)*cols+k];
			}
		} else {
			if (i - cols + rows > 0) {
				ud--;
				if (ud >= max)
					ud = max;
			}
			for (k = 0; k < ud; k++) {
				col[(k+i)*rows+k] = sig[k*cols+k+i];
			}
		}

	}

}